

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmatchPrintNtkStats.cpp
# Opt level: O2

void Bmatch_PrintMatchPairs
               (vector<std::pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>,_std::allocator<std::pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>_>_>
                *a)

{
  int iVar1;
  pointer ppVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  char *pcVar6;
  char *__format;
  ulong uVar7;
  ulong uVar8;
  
  uVar4 = (ulong)((long)(a->
                        super__Vector_base<std::pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>,_std::allocator<std::pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish -
                 (long)(a->
                       super__Vector_base<std::pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>,_std::allocator<std::pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start) >> 5;
  uVar5 = uVar4 & 0xffffffff;
  if ((int)uVar4 < 1) {
    uVar5 = 0;
  }
  for (uVar4 = 0; uVar4 != uVar5; uVar4 = uVar4 + 1) {
    pcVar6 = Abc_ObjName(((a->
                          super__Vector_base<std::pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>,_std::allocator<std::pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start[uVar4].first)->thisObj);
    printf("%7s is equivalent to : \n",pcVar6);
    ppVar2 = (a->
             super__Vector_base<std::pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>,_std::allocator<std::pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    uVar7 = (ulong)((long)*(pointer *)
                           ((long)&ppVar2[uVar4].second.
                                   super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>.
                                   _M_impl + 8) -
                   *(long *)&ppVar2[uVar4].second.
                             super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl) >>
            3;
    uVar8 = uVar7 & 0xffffffff;
    if ((int)uVar7 < 1) {
      uVar8 = 0;
    }
    for (uVar7 = 0; uVar8 != uVar7; uVar7 = uVar7 + 1) {
      lVar3 = *(long *)(*(long *)&(a->
                                  super__Vector_base<std::pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>,_std::allocator<std::pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start[uVar4].second.
                                  super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>.
                                  _M_impl + uVar7 * 8);
      iVar1 = *(int *)(lVar3 + 0x28);
      pcVar6 = Abc_ObjName(*(Abc_Obj_t **)(lVar3 + 8));
      __format = "%9s \n";
      if (iVar1 == 2) {
        __format = "-%8s \n";
      }
      printf(__format,pcVar6);
    }
  }
  return;
}

Assistant:

void Bmatch_PrintMatchPairs ( vector< pair < suppWrap *, vector< suppWrap * > > > & a )
{
    for( int i = 0, n = a.size(); i < n; ++i ) {
        printf("%7s is equivalent to : \n", Abc_ObjName( a[i].first->thisObj ) );
        for( int j = 0, m = a[i].second.size(); j < m; ++j ) {
        	if( a[i].second[j]->status == NEGATIVE )
            	printf( "-%8s \n", Abc_ObjName( a[i].second[j]->thisObj ));
            else
            	printf( "%9s \n", Abc_ObjName( a[i].second[j]->thisObj ));
        }
    }
}